

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O1

_Bool handle_g_context_store_item(menu_conflict *menu,ui_event *event,wchar_t oid)

{
  _Bool _Var1;
  ui_event mod_event;
  ui_event out_event;
  ui_event local_18;
  ui_event local_c;
  
  if ((event->type == EVT_KBRD) && ((event->key).code == 0x67)) {
    local_18._8_4_ = *(undefined4 *)&(event->key).mods;
    local_18.type = (event->mouse).type;
    local_18.key.code = 0x70;
    _Var1 = menu_handle_keypress(menu,&local_18,&local_c);
    return _Var1;
  }
  return false;
}

Assistant:

static bool handle_g_context_store_item(struct menu *menu,
		const ui_event *event, int oid)
{
	if (event->type == EVT_KBRD && event->key.code == 'g') {
		ui_event mod_event, out_event;

		mod_event = *event;
		mod_event.key.code = 'p';
		return menu_handle_keypress(menu, &mod_event, &out_event);
	}
	return false;
}